

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

BaseState<true> * __thiscall
ArrayToVectorState<true,_float>::Uint
          (ArrayToVectorState<true,_float> *this,Context<true> *param_1,uint f)

{
  float local_c;
  
  local_c = (float)f;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(this->output_array,&local_c);
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& /* ctx */, unsigned f)
  {
    output_array->push_back((T)f);
    return this;
  }